

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::SingleFailureChecker::SingleFailureChecker
          (SingleFailureChecker *this,TestPartResultArray *results,Type type,string *substr)

{
  long lVar1;
  long in_FS_OFFSET;
  string *substr_local;
  Type type_local;
  TestPartResultArray *results_local;
  SingleFailureChecker *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->results_ = results;
  this->type_ = type;
  std::__cxx11::string::string((string *)&this->substr_,(string *)substr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SingleFailureChecker::SingleFailureChecker(const TestPartResultArray* results,
                                           TestPartResult::Type type,
                                           const std::string& substr)
    : results_(results), type_(type), substr_(substr) {}